

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralAnalysisModel::IfcStructuralAnalysisModel
          (IfcStructuralAnalysisModel *this)

{
  IfcStructuralAnalysisModel *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x170,"IfcStructuralAnalysisModel");
  IfcSystem::IfcSystem(&this->super_IfcSystem,&PTR_construction_vtable_24__0107af88);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcStructuralAnalysisModel,_4UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcStructuralAnalysisModel,_4UL> *)
             &(this->super_IfcSystem).super_IfcGroup.field_0xf0,
             &PTR_construction_vtable_24__0107b078);
  *(undefined8 *)&(this->super_IfcSystem).super_IfcGroup.super_IfcObject = 0x107ae80;
  *(undefined8 *)&this->field_0x170 = 0x107af70;
  *(undefined8 *)&(this->super_IfcSystem).super_IfcGroup.super_IfcObject.field_0x88 = 0x107aea8;
  (this->super_IfcSystem).super_IfcGroup.super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x107aed0;
  *(undefined8 *)&(this->super_IfcSystem).super_IfcGroup.super_IfcObject.field_0xd0 = 0x107aef8;
  *(undefined8 *)&(this->super_IfcSystem).super_IfcGroup.super_IfcObject.field_0xe0 = 0x107af20;
  *(undefined8 *)&(this->super_IfcSystem).super_IfcGroup.field_0xf0 = 0x107af48;
  std::__cxx11::string::string((string *)&(this->super_IfcSystem).field_0x100);
  STEP::Maybe<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcAxis2Placement3D>_>::Maybe
            (&this->OrientationOf2DPlane);
  STEP::
  Maybe<Assimp::STEP::ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcStructuralLoadGroup>,_1UL,_0UL>_>
  ::Maybe(&this->LoadedBy);
  STEP::
  Maybe<Assimp::STEP::ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcStructuralResultGroup>,_1UL,_0UL>_>
  ::Maybe(&this->HasResults);
  return;
}

Assistant:

IfcStructuralAnalysisModel() : Object("IfcStructuralAnalysisModel") {}